

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O0

size_t duckdb_zstd::FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int local_80;
  int max;
  int count;
  uint start;
  int previousIs0;
  uint alphabetSize;
  uint symbol;
  int bitCount;
  U32 bitStream;
  int threshold;
  int remaining;
  int tableSize;
  int nbBits;
  BYTE *oend;
  BYTE *out;
  BYTE *ostart;
  uint writeIsSafe_local;
  uint tableLog_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  size_t headerBufferSize_local;
  void *header_local;
  BYTE *local_8;
  
  threshold = 1 << ((byte)tableLog & 0x1f);
  symbol = 0;
  uVar1 = maxSymbolValue + 1;
  bVar5 = false;
  bitStream = tableLog - 5;
  bitCount = 4;
  remaining = threshold + 1;
  nbBits = tableLog + 1;
  out = (BYTE *)header;
  while (symbol < uVar1 && 1 < remaining) {
    iVar3 = bitCount;
    if (bVar5) {
      start = symbol;
      while( true ) {
        bVar5 = false;
        if (symbol < uVar1) {
          bVar5 = normalizedCounter[symbol] == 0;
        }
        if (!bVar5) break;
        symbol = symbol + 1;
      }
      if (symbol == uVar1) break;
      while (start + 0x18 <= symbol) {
        start = start + 0x18;
        uVar2 = (0xffff << ((byte)bitCount & 0x1f)) + bitStream;
        if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < out)) {
          return 0xffffffffffffffba;
        }
        *out = (BYTE)uVar2;
        out[1] = (BYTE)(uVar2 >> 8);
        out = out + 2;
        bitStream = uVar2 >> 0x10;
      }
      for (; start + 3 <= symbol; start = start + 3) {
        bitStream = (3 << ((byte)bitCount & 0x1f)) + bitStream;
        bitCount = bitCount + 2;
      }
      bitStream = (symbol - start << ((byte)bitCount & 0x1f)) + bitStream;
      iVar3 = bitCount + 2;
      if (0x10 < bitCount + 2) {
        if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < out)) {
          return 0xffffffffffffffba;
        }
        *out = (BYTE)bitStream;
        out[1] = (BYTE)(bitStream >> 8);
        out = out + 2;
        bitStream = bitStream >> 0x10;
        iVar3 = bitCount + -0xe;
      }
    }
    bitCount = iVar3;
    uVar2 = symbol + 1;
    iVar3 = (int)normalizedCounter[symbol];
    iVar4 = (threshold * 2 + -1) - remaining;
    local_80 = iVar3;
    if (iVar3 < 0) {
      local_80 = -iVar3;
    }
    remaining = remaining - local_80;
    count = iVar3 + 1;
    if (threshold <= count) {
      count = iVar4 + count;
    }
    bitStream = (count << ((byte)bitCount & 0x1f)) + bitStream;
    bitCount = (nbBits + bitCount) - (uint)(count < iVar4);
    bVar5 = count == 1;
    if (remaining < 1) {
      return 0xffffffffffffffff;
    }
    for (; remaining < threshold; threshold = threshold >> 1) {
      nbBits = nbBits + -1;
    }
    symbol = uVar2;
    if (0x10 < bitCount) {
      if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < out)) {
        return 0xffffffffffffffba;
      }
      *out = (BYTE)bitStream;
      out[1] = (BYTE)(bitStream >> 8);
      out = out + 2;
      bitStream = bitStream >> 0x10;
      bitCount = bitCount + -0x10;
    }
  }
  if (remaining == 1) {
    if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < out)) {
      local_8 = (BYTE *)0xffffffffffffffba;
    }
    else {
      *out = (BYTE)bitStream;
      out[1] = (BYTE)(bitStream >> 8);
      local_8 = out + ((long)((bitCount + 7) / 8) - (long)header);
    }
  }
  else {
    local_8 = (BYTE *)0xffffffffffffffff;
  }
  return (size_t)local_8;
}

Assistant:

static size_t
FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                   const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                         unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream = 0;
    int bitCount = 0;
    unsigned symbol = 0;
    unsigned const alphabetSize = maxSymbolValue + 1;
    int previousIs0 = 0;

    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = (int)tableLog+1;

    while ((symbol < alphabetSize) && (remaining>1)) {  /* stops at 1 */
        if (previousIs0) {
            unsigned start = symbol;
            while ((symbol < alphabetSize) && !normalizedCounter[symbol]) symbol++;
            if (symbol == alphabetSize) break;   /* incorrect distribution */
            while (symbol >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (symbol >= start+3) {
                start+=3;
                bitStream += 3U << bitCount;
                bitCount += 2;
            }
            bitStream += (symbol-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[symbol++];
            int const max = (2*threshold-1) - remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold)
                count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += (U32)count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previousIs0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2))
                return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    if (remaining != 1)
        return ERROR(GENERIC);  /* incorrect normalized distribution */
    assert(symbol <= alphabetSize);

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2))
        return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    assert(out >= ostart);
    return (size_t)(out-ostart);
}